

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O3

bool __thiscall OpenMD::SelectionCompiler::lookingAtSpecialString(SelectionCompiler *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  iVar1 = this->ichToken;
  iVar3 = iVar1;
  if (iVar1 < this->cchScript) {
    uVar4 = (uint)(byte)(this->script)._M_dataplus._M_p[iVar1];
    iVar2 = iVar1;
    do {
      if ((uVar4 < 0x3c) && (iVar3 = iVar1, (0x800000000002400U >> ((ulong)uVar4 & 0x3f) & 1) != 0))
      break;
      iVar3 = iVar2 + 1;
      iVar2 = iVar3;
    } while (iVar3 < this->cchScript);
  }
  this->cchToken = iVar3 - iVar1;
  return iVar3 - iVar1 != 0 && iVar1 <= iVar3;
}

Assistant:

bool SelectionCompiler::lookingAtSpecialString() {
    int ichT = ichToken;
    char ch  = script[ichT];
    while (ichT < cchScript && ch != ';' && ch != '\r' && ch != '\n') {
      ++ichT;
    }
    cchToken = ichT - ichToken;
    return cchToken > 0;
  }